

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::init_frame(jpeg_decoder *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint8 *puVar4;
  jpgd_block_t *pjVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  if (this->m_comps_in_frame == 3) {
    if ((((this->m_comp_h_samp[1] != 1) || (this->m_comp_v_samp[1] != 1)) ||
        (this->m_comp_h_samp[2] != 1)) || (this->m_comp_v_samp[2] != 1)) goto LAB_0011be47;
    uVar8 = this->m_comp_h_samp[0];
    uVar1 = this->m_comp_v_samp[0];
    iVar6 = 8;
    iVar2 = iVar6;
    if ((uVar8 ^ 1) == 0 && (uVar1 ^ 1) == 0) {
      iVar3 = 3;
      iVar7 = 1;
      iVar9 = 4;
    }
    else {
      iVar3 = 4;
      iVar9 = iVar3;
      if (uVar8 == 2 && (uVar1 ^ 1) == 0) {
        iVar7 = 2;
        iVar6 = 0x10;
      }
      else if ((uVar8 ^ 1) == 0 && uVar1 == 2) {
        iVar2 = 0x10;
        iVar7 = 3;
      }
      else {
        if ((uVar8 != 2) || (uVar1 != 2)) goto LAB_0011be47;
        iVar3 = 6;
        iVar7 = 4;
        iVar9 = iVar7;
        iVar6 = 0x10;
        iVar2 = 0x10;
      }
    }
  }
  else {
    if (this->m_comps_in_frame != 1) {
      stop_decoding(this,JPGD_UNSUPPORTED_COLORSPACE);
    }
    if ((this->m_comp_h_samp[0] != 1) || (this->m_comp_v_samp[0] != 1)) {
LAB_0011be47:
      stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
    }
    iVar7 = 0;
    iVar3 = 1;
    iVar9 = iVar3;
    iVar6 = 8;
    iVar2 = 8;
  }
  this->m_scan_type = iVar7;
  this->m_max_blocks_per_mcu = iVar3;
  this->m_max_mcu_x_size = iVar6;
  this->m_max_mcu_y_size = iVar2;
  iVar3 = this->m_image_x_size;
  this->m_max_mcus_per_row = (iVar3 + iVar6 + -1) / iVar6;
  this->m_max_mcus_per_col = (this->m_image_y_size + iVar2 + -1) / iVar2;
  this->m_dest_bytes_per_pixel = iVar9;
  uVar8 = (iVar3 + 0xfU & 0xfff0) * iVar9;
  this->m_dest_bytes_per_scan_line = uVar8;
  this->m_real_dest_bytes_per_scan_line = iVar9 * iVar3;
  puVar4 = (uint8 *)alloc(this,(ulong)uVar8,true);
  this->m_pScan_line_0 = puVar4;
  if (this->m_scan_type - 3U < 2) {
    puVar4 = (uint8 *)alloc(this,(long)this->m_dest_bytes_per_scan_line,true);
    this->m_pScan_line_1 = puVar4;
  }
  iVar2 = this->m_max_mcus_per_row * this->m_max_blocks_per_mcu;
  this->m_max_blocks_per_row = iVar2;
  if (0x2000 < iVar2) {
    stop_decoding(this,JPGD_ASSERTION_ERROR);
  }
  pjVar5 = (jpgd_block_t *)alloc(this,(long)this->m_max_blocks_per_mcu << 7,false);
  this->m_pMCU_coefficients = pjVar5;
  iVar2 = this->m_max_blocks_per_mcu;
  for (lVar10 = 0; lVar10 < iVar2; lVar10 = lVar10 + 1) {
    this->m_mcu_block_max_zag[lVar10] = 0x40;
  }
  iVar6 = this->m_comp_v_samp[0] * this->m_comp_h_samp[0];
  this->m_expanded_blocks_per_component = iVar6;
  iVar6 = iVar6 * this->m_comps_in_frame;
  this->m_expanded_blocks_per_mcu = iVar6;
  iVar2 = this->m_max_mcus_per_row * iVar6;
  this->m_expanded_blocks_per_row = iVar2;
  this->m_freq_domain_chroma_upsample = iVar6 == 0xc;
  if (iVar6 != 0xc) {
    iVar2 = this->m_max_blocks_per_row;
  }
  puVar4 = (uint8 *)alloc(this,(long)(iVar2 << 6),false);
  this->m_pSample_buf = puVar4;
  this->m_total_lines_left = this->m_image_y_size;
  this->m_mcu_lines_left = 0;
  create_look_ups(this);
  return;
}

Assistant:

void jpeg_decoder::init_frame() {
  int i;

  if (m_comps_in_frame == 1) {
    if ((m_comp_h_samp[0] != 1) || (m_comp_v_samp[0] != 1))
      stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

    m_scan_type = JPGD_GRAYSCALE;
    m_max_blocks_per_mcu = 1;
    m_max_mcu_x_size = 8;
    m_max_mcu_y_size = 8;
  } else if (m_comps_in_frame == 3) {
    if (((m_comp_h_samp[1] != 1) || (m_comp_v_samp[1] != 1)) ||
        ((m_comp_h_samp[2] != 1) || (m_comp_v_samp[2] != 1)))
      stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

    if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1)) {
      m_scan_type = JPGD_YH1V1;

      m_max_blocks_per_mcu = 3;
      m_max_mcu_x_size = 8;
      m_max_mcu_y_size = 8;
    } else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1)) {
      m_scan_type = JPGD_YH2V1;
      m_max_blocks_per_mcu = 4;
      m_max_mcu_x_size = 16;
      m_max_mcu_y_size = 8;
    } else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 2)) {
      m_scan_type = JPGD_YH1V2;
      m_max_blocks_per_mcu = 4;
      m_max_mcu_x_size = 8;
      m_max_mcu_y_size = 16;
    } else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2)) {
      m_scan_type = JPGD_YH2V2;
      m_max_blocks_per_mcu = 6;
      m_max_mcu_x_size = 16;
      m_max_mcu_y_size = 16;
    } else
      stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);
  } else
    stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

  m_max_mcus_per_row = (m_image_x_size + (m_max_mcu_x_size - 1)) / m_max_mcu_x_size;
  m_max_mcus_per_col = (m_image_y_size + (m_max_mcu_y_size - 1)) / m_max_mcu_y_size;

  // These values are for the *destination* pixels: after conversion.
  if (m_scan_type == JPGD_GRAYSCALE)
    m_dest_bytes_per_pixel = 1;
  else
    m_dest_bytes_per_pixel = 4;

  m_dest_bytes_per_scan_line = ((m_image_x_size + 15) & 0xFFF0) * m_dest_bytes_per_pixel;

  m_real_dest_bytes_per_scan_line = (m_image_x_size * m_dest_bytes_per_pixel);

  // Initialize two scan line buffers.
  m_pScan_line_0 = (uint8*)alloc(m_dest_bytes_per_scan_line, true);
  if ((m_scan_type == JPGD_YH1V2) || (m_scan_type == JPGD_YH2V2))
    m_pScan_line_1 = (uint8*)alloc(m_dest_bytes_per_scan_line, true);

  m_max_blocks_per_row = m_max_mcus_per_row * m_max_blocks_per_mcu;

  // Should never happen
  if (m_max_blocks_per_row > JPGD_MAX_BLOCKS_PER_ROW)
    stop_decoding(JPGD_ASSERTION_ERROR);

  // Allocate the coefficient buffer, enough for one MCU
  m_pMCU_coefficients = (jpgd_block_t*)alloc(m_max_blocks_per_mcu * 64 * sizeof(jpgd_block_t));

  for (i = 0; i < m_max_blocks_per_mcu; i++)
    m_mcu_block_max_zag[i] = 64;

  m_expanded_blocks_per_component = m_comp_h_samp[0] * m_comp_v_samp[0];
  m_expanded_blocks_per_mcu = m_expanded_blocks_per_component * m_comps_in_frame;
  m_expanded_blocks_per_row = m_max_mcus_per_row * m_expanded_blocks_per_mcu;
  // Freq. domain chroma upsampling is only supported for H2V2 subsampling factor (the most common one I've seen).
  m_freq_domain_chroma_upsample = false;
#if JPGD_SUPPORT_FREQ_DOMAIN_UPSAMPLING
  m_freq_domain_chroma_upsample = (m_expanded_blocks_per_mcu == 4 * 3);
#endif

  if (m_freq_domain_chroma_upsample)
    m_pSample_buf = (uint8*)alloc(m_expanded_blocks_per_row * 64);
  else
    m_pSample_buf = (uint8*)alloc(m_max_blocks_per_row * 64);

  m_total_lines_left = m_image_y_size;

  m_mcu_lines_left = 0;

  create_look_ups();
}